

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

bool __thiscall duckdb::ARTKey::operator==(ARTKey *this,ARTKey *key)

{
  data_t *pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  bool bVar4;
  
  if (this->len != key->len) {
    return false;
  }
  iVar3 = 0;
  do {
    bVar4 = this->len == iVar3;
    if (bVar4) {
      return bVar4;
    }
    pdVar1 = this->data + iVar3;
    pdVar2 = key->data + iVar3;
    iVar3 = iVar3 + 1;
  } while (*pdVar1 == *pdVar2);
  return bVar4;
}

Assistant:

bool ARTKey::operator==(const ARTKey &key) const {
	if (len != key.len) {
		return false;
	}
	for (idx_t i = 0; i < len; i++) {
		if (data[i] != key.data[i]) {
			return false;
		}
	}
	return true;
}